

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O3

int mz_zip_reader_locate_file(mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags)

{
  byte bVar1;
  ushort uVar2;
  mz_uint mVar3;
  uint uVar4;
  mz_zip_internal_state *pmVar5;
  void *pvVar6;
  void *pvVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  size_t __n;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  byte *pbVar18;
  ulong uVar19;
  byte bVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  byte *pbVar24;
  byte *pbVar25;
  int iVar26;
  byte bVar27;
  void *local_70;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return -1;
  }
  pmVar5 = pZip->m_pState;
  if (pName == (char *)0x0 || pmVar5 == (mz_zip_internal_state *)0x0) {
    return -1;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_READING) {
    return -1;
  }
  if ((pComment == (char *)0x0 && (flags & 0x300) == 0) &&
     ((pmVar5->m_sorted_central_dir_offsets).m_size != 0)) {
    mVar3 = pZip->m_total_files;
    pvVar6 = (pmVar5->m_sorted_central_dir_offsets).m_p;
    sVar10 = strlen(pName);
    if (0 < (int)mVar3) {
      iVar26 = mVar3 - 1;
      pvVar7 = (pmVar5->m_central_dir).m_p;
      iVar21 = 0;
      do {
        uVar23 = (uint)(iVar26 + iVar21) >> 1;
        uVar4 = *(uint *)((long)pvVar6 + (ulong)uVar23 * 4);
        uVar12 = (ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + (ulong)uVar4 * 4);
        pbVar24 = (byte *)((long)pvVar7 + uVar12 + 0x2e);
        uVar14 = (uint)*(ushort *)((long)pvVar7 + uVar12 + 0x1c);
        uVar17 = (ulong)uVar14;
        if ((uint)sVar10 <= uVar14) {
          uVar17 = sVar10 & 0xffffffff;
        }
        pbVar25 = (byte *)((long)pvVar7 + uVar17 + uVar12 + 0x2e);
        pbVar18 = (byte *)pName;
        if ((int)uVar17 == 0) {
          iVar16 = 0;
        }
        else {
          do {
            bVar1 = *pbVar24;
            bVar20 = bVar1 + 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar20 = bVar1;
            }
            bVar1 = *pbVar18;
            bVar27 = bVar1 + 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar27 = bVar1;
            }
            if (bVar20 != bVar27) break;
            pbVar24 = pbVar24 + 1;
            pbVar18 = pbVar18 + 1;
            bVar27 = bVar20;
          } while (pbVar24 < pbVar25);
          iVar16 = (uint)bVar20 - (uint)bVar27;
        }
        if (pbVar24 == pbVar25) {
          iVar16 = uVar14 - (uint)sVar10;
        }
        if (iVar16 == 0) {
          return uVar4;
        }
        iVar9 = uVar23 - 1;
        if (iVar16 < 0) {
          iVar21 = uVar23 + 1;
          iVar9 = iVar26;
        }
        iVar26 = iVar9;
      } while (iVar21 <= iVar26);
    }
  }
  else {
    sVar10 = strlen(pName);
    if (0xffff < sVar10) {
      return -1;
    }
    if (pComment == (char *)0x0) {
      __n = 0;
    }
    else {
      __n = strlen(pComment);
      if (0xffff < __n) {
        return -1;
      }
    }
    uVar4 = pZip->m_total_files;
    if ((ulong)uVar4 == 0) {
      return -1;
    }
    pvVar6 = (pmVar5->m_central_dir).m_p;
    pvVar7 = (pmVar5->m_central_dir_offsets).m_p;
    uVar17 = 0;
    do {
      uVar19 = (ulong)*(uint *)((long)pvVar7 + uVar17 * 4);
      uVar2 = *(ushort *)((long)pvVar6 + uVar19 + 0x1c);
      uVar12 = (ulong)uVar2;
      if (sVar10 <= uVar12) {
        local_70 = (void *)((long)pvVar6 + uVar19 + 0x2e);
        if (__n != 0) {
          uVar11 = (ulong)*(ushort *)((long)pvVar6 + uVar19 + 0x20);
          if (__n != uVar11) goto LAB_00132c7f;
          uVar22 = (ulong)*(ushort *)((long)pvVar6 + uVar19 + 0x1e);
          if ((flags >> 8 & 1) == 0) {
            uVar15 = 0;
            do {
              bVar1 = pComment[uVar15];
              iVar26 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                iVar26 = (int)(char)bVar1;
              }
              bVar1 = *(byte *)((long)pvVar6 + uVar15 + uVar22 + uVar19 + uVar12 + 0x2e);
              iVar21 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                iVar21 = (int)(char)bVar1;
              }
              if (iVar26 != iVar21) goto LAB_00132c7f;
              uVar15 = uVar15 + 1;
            } while (uVar11 != uVar15);
          }
          else {
            iVar26 = bcmp(pComment,(void *)((long)local_70 + uVar22 + uVar12),__n);
            if (iVar26 != 0) goto LAB_00132c7f;
          }
        }
        if (((flags >> 9 & 1) != 0) && (uVar2 != 0)) {
          do {
            uVar14 = *(byte *)((long)pvVar6 + uVar12 + uVar19 + 0x2d) - 0x2f;
            if ((uVar14 < 0x2e) && ((0x200000000801U >> ((ulong)uVar14 & 0x3f) & 1) != 0))
            goto LAB_00132bfe;
            bVar8 = 1 < (long)uVar12;
            uVar12 = uVar12 - 1;
          } while (bVar8);
          uVar12 = 0;
LAB_00132bfe:
          local_70 = (void *)((long)local_70 + (uVar12 & 0xffffffff));
          uVar12 = (ulong)((uint)uVar2 - (int)uVar12);
        }
        if (sVar10 == uVar12) {
          if ((flags >> 8 & 1) == 0) {
            if ((int)uVar12 == 0) {
LAB_00132c9a:
              return (int)uVar17;
            }
            sVar13 = 0;
            while( true ) {
              bVar1 = pName[sVar13];
              iVar26 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                iVar26 = (int)(char)bVar1;
              }
              bVar1 = *(byte *)((long)local_70 + sVar13);
              iVar21 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                iVar21 = (int)(char)bVar1;
              }
              if (iVar26 != iVar21) break;
              sVar13 = sVar13 + 1;
              if (sVar10 == sVar13) goto LAB_00132c9a;
            }
          }
          else {
            iVar26 = bcmp(pName,local_70,sVar10);
            if (iVar26 == 0) goto LAB_00132c9a;
          }
        }
      }
LAB_00132c7f:
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar4);
  }
  return -1;
}

Assistant:

int mz_zip_reader_locate_file(mz_zip_archive *pZip, const char *pName, const char *pComment, mz_uint flags)
{
  mz_uint file_index; size_t name_len, comment_len;
  if ((!pZip) || (!pZip->m_pState) || (!pName) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    return -1;
  if (((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) && (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size))
    return mz_zip_reader_locate_file_binary_search(pZip, pName);
  name_len = strlen(pName); if (name_len > 0xFFFF) return -1;
  comment_len = pComment ? strlen(pComment) : 0; if (comment_len > 0xFFFF) return -1;
  for (file_index = 0; file_index < pZip->m_total_files; file_index++)
  {
    const mz_uint8 *pHeader = &MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir, mz_uint8, MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index));
    mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    const char *pFilename = (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
    if (filename_len < name_len)
      continue;
    if (comment_len)
    {
      mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS), file_comment_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
      const char *pFile_comment = pFilename + filename_len + file_extra_len;
      if ((file_comment_len != comment_len) || (!mz_zip_reader_string_equal(pComment, pFile_comment, file_comment_len, flags)))
        continue;
    }
    if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len))
    {
      int ofs = filename_len - 1;
      do
      {
        if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') || (pFilename[ofs] == ':'))
          break;
      } while (--ofs >= 0);
      ofs++;
      pFilename += ofs; filename_len -= ofs;
    }
    if ((filename_len == name_len) && (mz_zip_reader_string_equal(pName, pFilename, filename_len, flags)))
      return file_index;
  }
  return -1;
}